

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (UnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  float fVar1;
  bool bVar2;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_01;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar6;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar7;
  char *pcVar8;
  long lVar9;
  Index IVar10;
  Scalar *pSVar11;
  AssertHelper local_428;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_2;
  int j;
  int i;
  Message local_3f8;
  Index local_3f0;
  Index local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3c8;
  Message local_3c0;
  Index local_3b8;
  Index local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar;
  Matrix<T,_3,_2> K;
  Scalar local_378;
  Scalar local_374;
  Scalar local_370;
  Scalar local_36c;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> local_368;
  undefined1 local_348 [8];
  Matrix<T,_3,_2> K_ref;
  Scalar local_328;
  Scalar local_324;
  Scalar local_320;
  Scalar local_31c;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> local_318;
  DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> local_2f4 [8];
  Matrix<T,_3,_2> P_xy_ref;
  Scalar local_2d4;
  Scalar local_2d0;
  Scalar local_2cc;
  Scalar local_2c8;
  Scalar local_2c4;
  Scalar local_2c0;
  Scalar local_2bc;
  Scalar local_2b8;
  Scalar local_2b4;
  Scalar local_2b0;
  Scalar local_2ac;
  Scalar local_2a8;
  Scalar local_2a4;
  Scalar local_2a0;
  Scalar local_29c;
  Scalar local_298;
  Scalar local_294;
  Scalar local_290;
  Scalar local_28c;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> local_288;
  Scalar local_264;
  Scalar local_260;
  Scalar local_25c;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_258;
  Scalar local_238;
  Scalar local_234;
  Scalar local_230;
  Scalar local_22c;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_228;
  undefined1 local_208 [8];
  Matrix<T,_2,_2> P_yy;
  Scalar local_1f0;
  Scalar local_1ec;
  Scalar local_1e8;
  Scalar local_1e4;
  Scalar local_1e0;
  Scalar local_1dc;
  Scalar local_1d8;
  Scalar local_1d4;
  Scalar local_1d0;
  Scalar local_1cc;
  Scalar local_1c8;
  Scalar local_1c4;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> local_1c0;
  undefined1 local_1a0 [8];
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> local_160;
  Vector<float,_2> local_140;
  Vector<float,_2> mean;
  Scalar local_130;
  Scalar local_12c;
  Scalar local_128 [4];
  Scalar local_118;
  Scalar local_114;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> local_110;
  undefined1 local_ec [8];
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  T kappa;
  T beta;
  T alpha;
  UnscentedKalmanFilter_computeKalmanGain_Test *this_local;
  
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 2.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1.0;
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_ec,1.0,2.0,1.0);
  local_114 = 3.0;
  Eigen::DenseBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator<<
            (&local_110,
             (DenseBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14),&local_114);
  local_118 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (&local_110,&local_118);
  local_128[0] = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar3,local_128);
  local_12c = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar3,&local_12c);
  local_130 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar3,&local_130);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[1] = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar3,mean.super_Matrix<float,_2,_1>.
                             super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                             m_data.array + 1);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar3,(Scalar *)&mean);
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::~CommaInitializer(&local_110);
  Kalman::Vector<float,_2>::Vector(&local_140);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xd] = 2.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator<<
            (&local_160,(DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&local_140,
             sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
             m_data.array + 0xd);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 3.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
            (&local_160,
             sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
             m_data.array + 0xc);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_160);
  Eigen::Matrix<float,_2,_7,_0,_2,_7>::Matrix((Matrix<float,_2,_7,_0,_2,_7> *)local_1a0);
  local_1c4 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator<<
            (&local_1c0,(DenseBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_1a0,&local_1c4);
  local_1c8 = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (&local_1c0,&local_1c8);
  local_1cc = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1cc);
  local_1d0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1d0);
  local_1d4 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1d4);
  local_1d8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1d8);
  local_1dc = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1dc);
  local_1e0 = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1e0);
  local_1e4 = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1e4);
  local_1e8 = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1e8);
  local_1ec = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1ec);
  local_1f0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,&local_1f0);
  P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar4,P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array + 3);
  P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
            (pCVar4,P_yy.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                    m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::~CommaInitializer(&local_1c0);
  Eigen::Matrix<float,_2,_2,_0,_2,_2>::Matrix((Matrix<float,_2,_2,_0,_2,_2> *)local_208);
  local_22c = 35.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator<<
            (&local_228,(DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_208,&local_22c);
  local_230 = 34.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (&local_228,&local_230);
  local_234 = 34.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar5,&local_234);
  local_238 = 46.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar5,&local_238);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_228);
  local_25c = 3.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_258,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_ec,&local_25c);
  local_260 = 5.0;
  this_01 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                      (&local_258,&local_260);
  local_264 = 7.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(this_01,&local_264);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_258);
  local_28c = 3.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator<<
            (&local_288,
             (DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14),&local_28c);
  local_290 = 5.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (&local_288,&local_290);
  local_294 = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_294);
  local_298 = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_298);
  local_29c = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_29c);
  local_2a0 = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2a0);
  local_2a4 = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2a4);
  local_2a8 = 5.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2a8);
  local_2ac = 7.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2ac);
  local_2b0 = 7.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2b0);
  local_2b4 = 5.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2b4);
  local_2b8 = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2b8);
  local_2bc = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2bc);
  local_2c0 = 5.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2c0);
  local_2c4 = 7.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2c4);
  local_2c8 = 11.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2c8);
  local_2cc = 9.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2cc);
  local_2d0 = 9.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2d0);
  local_2d4 = 3.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,&local_2d4);
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
       5.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar6,P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 5);
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
            (pCVar6,P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                    m_data.array + 4);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::~CommaInitializer(&local_288);
  Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)local_2f4);
  local_31c = 20.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator<<
            (&local_318,local_2f4,&local_31c);
  local_320 = 20.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (&local_318,&local_320);
  local_324 = 20.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar7,&local_324);
  local_328 = 40.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar7,&local_328);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 40.0
  ;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar7,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 5);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 60.0
  ;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
            (pCVar7,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                    m_data.array + 4);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::~CommaInitializer(&local_318);
  Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)local_348);
  local_36c = 0.52863437;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator<<
            (&local_368,(DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_348,&local_36c);
  local_370 = 0.04405286;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (&local_368,&local_370);
  local_374 = -0.969163;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar7,&local_374);
  local_378 = 1.585903;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar7,&local_378);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
       -0.44052863;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar7,K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                             .m_data.array + 5);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.6299559;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
            (pCVar7,K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array + 4);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::~CommaInitializer(&local_368);
  this_00 = &gtest_ar.message_;
  Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)this_00);
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  computeKalmanGain<Kalman::Vector<float,_2>_>
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_ec,&local_140,
             (SigmaPoints<Kalman::Vector<float,_2>_> *)local_1a0,
             (Covariance<Kalman::Vector<float,_2>_> *)local_208,
             (KalmanGain<Kalman::Vector<float,_2>_> *)this_00);
  local_3b0 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_348);
  local_3b8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)this_00);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_3a8,"K_ref.rows()","K.rows()",&local_3b0,&local_3b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar2) {
    testing::Message::Message(&local_3c0);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0x82,pcVar8);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message(&local_3c0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_3e8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_348);
    local_3f0 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
                           &gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<long,long>
              ((EqHelper<false> *)local_3e0,"K_ref.cols()","K.cols()",&local_3e8,&local_3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar2) {
      testing::Message::Message(&local_3f8);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&j,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                 ,0x82,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&j,&local_3f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j);
      testing::Message::~Message(&local_3f8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      for (gtest_ar_2.message_.ptr_._4_4_ = 0; lVar9 = (long)gtest_ar_2.message_.ptr_._4_4_,
          IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::rows
                             ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_348),
          lVar9 < IVar10; gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
        for (gtest_ar_2.message_.ptr_._0_4_ = 0; lVar9 = (long)(int)gtest_ar_2.message_.ptr_,
            IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::cols
                               ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_348),
            lVar9 < IVar10; gtest_ar_2.message_.ptr_._0_4_ = (int)gtest_ar_2.message_.ptr_ + 1) {
          pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)local_348,
                               (long)gtest_ar_2.message_.ptr_._4_4_,
                               (long)(int)gtest_ar_2.message_.ptr_);
          fVar1 = *pSVar11;
          pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)
                               &gtest_ar.message_,(long)gtest_ar_2.message_.ptr_._4_4_,
                               (long)(int)gtest_ar_2.message_.ptr_);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_418,"K_ref(i,j)","K(i,j)","1e-6",(double)fVar1,
                     (double)*pSVar11,1e-06);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
          if (!bVar2) {
            testing::Message::Message(&local_420);
            pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
            testing::internal::AssertHelper::AssertHelper
                      (&local_428,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                       ,0x82,pcVar8);
            testing::internal::AssertHelper::operator=(&local_428,&local_420);
            testing::internal::AssertHelper::~AssertHelper(&local_428);
            testing::Message::~Message(&local_420);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
          if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename UnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> P_yy;
    P_yy <<
        35, 34,
        34, 46;
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, P_yy, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}